

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O3

void __thiscall
spvtools::opt::BasicBlock::ForEachSuccessorLabel(BasicBlock *this,function<void_(unsigned_int)> *f)

{
  _Manager_type p_Var1;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_58 = (_Manager_type)0x0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  p_Var1 = (f->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_68,(_Any_data *)f,__clone_functor);
    p_Stack_50 = f->_M_invoker;
    local_58 = (f->super__Function_base)._M_manager;
  }
  p_Var1 = local_58;
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_40._M_unused._0_8_ = 0;
  *(char *)((long)local_40._M_unused._0_8_ + 8) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 9) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 10) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0xb) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0xc) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0xd) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0xe) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0xf) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x10) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x11) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x12) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x13) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x14) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x15) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x16) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x17) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x18) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x19) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x1a) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x1b) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x1c) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x1d) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x1e) = '\0';
  *(char *)((long)local_40._M_unused._0_8_ + 0x1f) = '\0';
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)local_40._M_unused._0_8_,&local_68,__clone_functor);
    *(_Manager_type *)((long)local_40._M_unused._0_8_ + 0x10) = local_58;
    *(_Invoker_type *)((long)local_40._M_unused._0_8_ + 0x18) = p_Stack_50;
  }
  local_28 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.cpp:107:27)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.cpp:107:27)>
             ::_M_manager;
  WhileEachSuccessorLabel(this,(function<bool_(unsigned_int)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

void BasicBlock::ForEachSuccessorLabel(
    const std::function<void(const uint32_t)>& f) const {
  WhileEachSuccessorLabel([f](const uint32_t l) {
    f(l);
    return true;
  });
}